

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O2

int Gia_ManCollectReachable(Gia_Man_t *pAig,int nStatesMax,int fMiter,int fDumpFile,int fVerbose)

{
  long lVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  abctime aVar6;
  Gia_ManEra_t *p;
  Gia_ObjEra_t *pGVar7;
  abctime aVar8;
  FILE *__stream;
  int level;
  char *__format;
  uint uVar9;
  undefined1 auVar10 [16];
  
  aVar6 = Abc_Clock();
  if (0xc < pAig->vCis->nSize - pAig->nRegs) {
    __assert_fail("Gia_ManPiNum(pAig) <= 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEra.c"
                  ,0x216,"int Gia_ManCollectReachable(Gia_Man_t *, int, int, int, int)");
  }
  if (pAig->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEra.c"
                  ,0x217,"int Gia_ManCollectReachable(Gia_Man_t *, int, int, int, int)");
  }
  p = Gia_ManEraCreate(pAig);
  pGVar7 = Gia_ManEraCreateState(p);
  pGVar7->Cond = 0;
  pGVar7->iPrev = 0;
  pGVar7->iNext = 0;
  iVar3 = p->nWordsDat;
  memset(pGVar7 + 1,0,(long)iVar3 << 2);
  iVar3 = Gia_ManEraStateHash((uint *)(pGVar7 + 1),iVar3,p->nBins);
  p->pBins[iVar3] = pGVar7->Num;
  do {
    uVar9 = p->iCurState;
    iVar3 = p->vStates->nSize;
    if (iVar3 + -1 <= (int)uVar9) {
      iVar3 = 1;
LAB_005a34fe:
      uVar5 = Gia_ManCountDepth(p);
      level = 0x827bb7;
      printf("Reachability analysis traversed %d states with depth %d.  ",(ulong)(uVar9 - 1),
             (ulong)uVar5);
      Abc_Print(level,"%s =","Time");
      aVar8 = Abc_Clock();
      Abc_Print(level,"%9.2f sec\n",(double)(aVar8 - aVar6) / 1000000.0);
      if (fDumpFile != 0) {
        __stream = fopen("test.stg","wb");
        if (__stream == (FILE *)0x0) {
          __format = "Cannot open file \"%s\" for writing.\n";
        }
        else {
          Gia_ManStgPrint((FILE *)__stream,p->vStgDump,pAig->vCis->nSize - pAig->nRegs,
                          pAig->vCos->nSize - pAig->nRegs,uVar9 - 1);
          fclose(__stream);
          __format = "Extracted STG was written into file \"%s\".\n";
        }
        printf(__format,"test.stg");
      }
      Gia_ManEraFree(p);
      return iVar3;
    }
    if (nStatesMax <= iVar3) {
      printf("Reached the limit on states traversed (%d).  ",(ulong)(uint)nStatesMax);
      iVar3 = -1;
      goto LAB_005a34fe;
    }
    p->iCurState = uVar9 + 1;
    pGVar7 = Gia_ManEraState(p,uVar9 + 1);
    if (((int)uVar9 < 1) || (pGVar7->iPrev != 0)) {
      Gia_ManInsertState(p,pGVar7);
      Gia_ManPerformOneIter(p);
      iVar3 = Gia_ManAnalyzeResult(p,pGVar7,fMiter,fDumpFile);
      if ((fMiter != 0) && (iVar3 != 0)) {
        uVar9 = p->iCurState;
        iVar3 = 0;
        printf("Miter failed in state %d after %d transitions.  ",(ulong)uVar9,
               (ulong)(p->vBugTrace->nSize - 1));
        goto LAB_005a34fe;
      }
      if ((fVerbose != 0) && (uVar9 = p->iCurState, (int)uVar9 % 5000 == 0)) {
        pVVar2 = p->vStates;
        uVar5 = pVVar2->nSize;
        uVar4 = Gia_ManCountDepth(p);
        lVar1 = (long)p->nWordsDat * 4 + 0x10;
        auVar10._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar10._0_8_ = lVar1;
        auVar10._12_4_ = 0x45300000;
        iVar3 = 0x827b72;
        printf("States =%10d. Reached =%10d. R = %5.3f. Depth =%6d. Mem =%9.2f MB.  ",
               (double)(int)uVar9 / (double)(int)uVar5,
               ((double)pVVar2->nCap * 8.0 +
               (double)p->nBins * 4.0 +
               ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
               (double)pVVar2->nSize) * 9.5367431640625e-07,(ulong)uVar9,(ulong)uVar5,(ulong)uVar4);
        Abc_Print(iVar3,"%s =","Time");
        aVar8 = Abc_Clock();
        Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar8 - aVar6) / 1000000.0);
      }
    }
  } while( true );
}

Assistant:

int Gia_ManCollectReachable( Gia_Man_t * pAig, int nStatesMax, int fMiter, int fDumpFile, int fVerbose )
{ 
    Gia_ManEra_t * p;
    Gia_ObjEra_t * pState;
    int Hash;
    abctime clk = Abc_Clock();
    int RetValue = 1;
    assert( Gia_ManPiNum(pAig) <= 12 );
    assert( Gia_ManRegNum(pAig) > 0 );
    p = Gia_ManEraCreate( pAig );
    // create init state
    pState = Gia_ManEraCreateState( p );
    pState->Cond  = 0; 
    pState->iPrev = 0;
    pState->iNext = 0; 
    memset( pState->pData, 0, sizeof(unsigned) * p->nWordsDat );
    Hash = Gia_ManEraStateHash(pState->pData, p->nWordsDat, p->nBins);
    p->pBins[ Hash ] = pState->Num;
    // process reachable states
    while ( p->iCurState < Vec_PtrSize( p->vStates ) - 1 )
    {
        if ( Vec_PtrSize(p->vStates) >= nStatesMax )
        {
            printf( "Reached the limit on states traversed (%d).  ", nStatesMax );
            RetValue = -1;
            break;
        }
        pState = Gia_ManEraState( p, ++p->iCurState );
        if ( p->iCurState > 1 && pState->iPrev == 0 )
            continue;
//printf( "Extracting %d  ", p->iCurState );
//Extra_PrintBinary( stdout, p->pStateNew->pData, Gia_ManRegNum(p->pAig) );  printf( "\n" );
        Gia_ManInsertState( p, pState );
        Gia_ManPerformOneIter( p );
        if ( Gia_ManAnalyzeResult( p, pState, fMiter, fDumpFile ) && fMiter )
        {
            RetValue = 0;
            printf( "Miter failed in state %d after %d transitions.  ", 
                p->iCurState, Vec_IntSize(p->vBugTrace)-1 );
            break;
        }
        if ( fVerbose && p->iCurState % 5000 == 0 )
        {
            printf( "States =%10d. Reached =%10d. R = %5.3f. Depth =%6d. Mem =%9.2f MB.  ", 
                p->iCurState, Vec_PtrSize(p->vStates), 1.0*p->iCurState/Vec_PtrSize(p->vStates), Gia_ManCountDepth(p), 
                (1.0/(1<<20))*(1.0*Vec_PtrSize(p->vStates)*(sizeof(Gia_ObjEra_t) + sizeof(unsigned) * p->nWordsDat) + 
                   1.0*p->nBins*sizeof(unsigned) + 1.0*p->vStates->nCap * sizeof(void*)) );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }
    printf( "Reachability analysis traversed %d states with depth %d.  ", p->iCurState-1, Gia_ManCountDepth(p) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    if ( fDumpFile )
    {
        char * pFileName = "test.stg";
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            Gia_ManStgPrint( pFile, p->vStgDump, Gia_ManPiNum(pAig), Gia_ManPoNum(pAig), p->iCurState-1 );
            fclose( pFile );
            printf( "Extracted STG was written into file \"%s\".\n", pFileName );
        }
    }
    Gia_ManEraFree( p );
    return RetValue;
}